

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall
Catch::Session::applyCommandLine(Session *this,int argc,char **argv,DoWhat unusedOptionBehaviour)

{
  Colour colourGuard;
  exception *ex;
  DoWhat local_2c;
  char **ppcStack_28;
  DoWhat unusedOptionBehaviour_local;
  char **argv_local;
  Session *pSStack_18;
  int argc_local;
  Session *this_local;
  
  local_2c = unusedOptionBehaviour;
  ppcStack_28 = argv;
  argv_local._4_4_ = argc;
  pSStack_18 = this;
  Clara::CommandLine<Catch::ConfigData>::setThrowOnUnrecognisedTokens
            (&this->m_cli,unusedOptionBehaviour == Fail);
  Clara::CommandLine<Catch::ConfigData>::parseInto
            ((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             &ex,&this->m_cli,argv_local._4_4_,ppcStack_28,&this->m_configData);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::operator=
            (&this->m_unusedTokens,
             (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             &ex);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::~vector
            ((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             &ex);
  if (((this->m_configData).showHelp & 1U) != 0) {
    showHelp(this,&(this->m_configData).processName);
  }
  Ptr<Catch::Config>::reset(&this->m_config);
  return 0;
}

Assistant:

int applyCommandLine( int argc, char const* argv[], OnUnusedOptions::DoWhat unusedOptionBehaviour = OnUnusedOptions::Fail ) {
            try {
                m_cli.setThrowOnUnrecognisedTokens( unusedOptionBehaviour == OnUnusedOptions::Fail );
                m_unusedTokens = m_cli.parseInto( argc, argv, m_configData );
                if( m_configData.showHelp )
                    showHelp( m_configData.processName );
                m_config.reset();
            }
            catch( std::exception& ex ) {
                {
                    Colour colourGuard( Colour::Red );
                    Catch::cerr()
                        << "\nError(s) in input:\n"
                        << Text( ex.what(), TextAttributes().setIndent(2) )
                        << "\n\n";
                }
                m_cli.usage( Catch::cout(), m_configData.processName );
                return (std::numeric_limits<int>::max)();
            }
            return 0;
        }